

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O0

int notify_no_fd_interrupt(int epfd,epoll_event *events,int maxevents,int timeout)

{
  int *piVar1;
  int timeout_local;
  int maxevents_local;
  epoll_event *events_local;
  int epfd_local;
  
  if (epoll_wait_fake.call_count == 1) {
    piVar1 = __errno_location();
    *piVar1 = 4;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
  }
  return -1;
}

Assistant:

static int notify_no_fd_interrupt(int epfd, struct epoll_event *events,
                                  int maxevents, int timeout)
{
	(void)epfd;
	(void)maxevents;
	(void)timeout;
	(void)events;

	if (epoll_wait_fake.call_count == 1) {
		errno = EINTR;
		return -1;
	} else {
		errno = EINVAL;
		return -1;
	}
}